

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O3

void Mvc_CoverMakeTautology(Mvc_Cover_t *pCover)

{
  int *piVar1;
  uint uVar2;
  Mvc_Cube_t *pMVar3;
  uint uVar4;
  Mvc_Cube_t *pMVar5;
  byte bVar6;
  Mvc_Cube_t *pMVar7;
  
  pMVar7 = (Mvc_Cube_t *)&pCover->lCubes;
  pMVar5 = (pCover->lCubes).pHead;
  while (pMVar5 != (Mvc_Cube_t *)0x0) {
    pMVar3 = pMVar5->pNext;
    Mvc_CubeFree(pCover,pMVar5);
    pMVar5 = pMVar3;
  }
  ((Mvc_List_t *)pMVar7)->pHead = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).pTail = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).nItems = 0;
  pMVar5 = Mvc_CubeAlloc(pCover);
  uVar2 = *(uint *)&pMVar5->field_0x8;
  uVar4 = uVar2 & 0xffffff;
  bVar6 = (byte)(uVar2 >> 0x18);
  if ((ulong)uVar4 == 1) {
    pMVar5->pData[0] = 0xffffffff;
    *(uint *)&pMVar5->field_0x14 = 0xffffffff >> (bVar6 & 0x1f);
  }
  else if (uVar4 == 0) {
    pMVar5->pData[0] = 0xffffffff >> (bVar6 & 0x1f);
  }
  else {
    pMVar5->pData[uVar4] = 0xffffffff >> (bVar6 & 0x1f);
    memset(pMVar5->pData,0xff,(ulong)((uVar2 & 0xffffff) << 2));
  }
  if (((Mvc_List_t *)pMVar7)->pHead != (Mvc_Cube_t *)0x0) {
    pMVar7 = (pCover->lCubes).pTail;
  }
  pMVar7->pNext = pMVar5;
  (pCover->lCubes).pTail = pMVar5;
  pMVar5->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Mvc_CoverMakeTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCubeNew;
    Mvc_CoverMakeEmpty( pCover );
    pCubeNew = Mvc_CubeAlloc( pCover );
    Mvc_CubeBitFill( pCubeNew );
    Mvc_CoverAddCubeTail( pCover, pCubeNew );
}